

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::AllocateLiteralRegexArray(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  WriteBarrierPtr<UnifiedRegex::RegexPattern> *pWVar4;
  undefined4 *puVar5;
  Recycler *this_00;
  RegexPattern **ptr;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  pWVar4 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)18,Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>*>
                     ((FunctionProxy *)this);
  if (pWVar4 != (WriteBarrierPtr<UnifiedRegex::RegexPattern> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1982,"(!this->GetLiteralRegexes())","!this->GetLiteralRegexes()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar3 = GetLiteralRegexCount(this);
  if (uVar3 != 0) {
    local_40 = (undefined1  [8])&UnifiedRegex::RegexPattern*::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x1989;
    data.plusSize = (ulong)uVar3;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                         recycler,(TrackAllocData *)local_40);
    ptr = Memory::AllocateArray<Memory::Recycler,UnifiedRegex::RegexPattern*,false>
                    ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)uVar3);
    FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)18,UnifiedRegex::RegexPattern**>
              ((FunctionProxy *)this,ptr);
  }
  return;
}

Assistant:

void FunctionBody::AllocateLiteralRegexArray()
    {
        Assert(!this->GetLiteralRegexes());
        uint32 literalRegexCount = GetLiteralRegexCount();
        if (literalRegexCount == 0)
        {
            return;
        }

        this->SetLiteralRegexs(RecyclerNewArrayZ(m_scriptContext->GetRecycler(), UnifiedRegex::RegexPattern *, literalRegexCount));
    }